

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack19_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x7ffff;
  out[1] = uVar1 >> 0x13;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x13 | (uVar2 & 0x3f) << 0xd;
  out[2] = uVar2 >> 6 & 0x7ffff;
  out[3] = uVar2 >> 0x19;
  uVar1 = in[2];
  out[3] = uVar2 >> 0x19 | (uVar1 & 0xfff) << 7;
  out[4] = uVar1 >> 0xc & 0x7ffff;
  out[5] = uVar1 >> 0x1f;
  uVar2 = in[3];
  out[5] = uVar1 >> 0x1f | (uVar2 & 0x3ffff) << 1;
  out[6] = uVar2 >> 0x12;
  uVar1 = in[4];
  out[6] = uVar2 >> 0x12 | (uVar1 & 0x1f) << 0xe;
  out[7] = uVar1 >> 5 & 0x7ffff;
  out[8] = uVar1 >> 0x18;
  uVar2 = in[5];
  out[8] = uVar1 >> 0x18 | (uVar2 & 0x7ff) << 8;
  out[9] = uVar2 >> 0xb & 0x7ffff;
  out[10] = uVar2 >> 0x1e;
  uVar1 = in[6];
  out[10] = uVar2 >> 0x1e | (uVar1 & 0x1ffff) << 2;
  out[0xb] = uVar1 >> 0x11;
  uVar2 = in[7];
  out[0xb] = uVar1 >> 0x11 | (uVar2 & 0xf) << 0xf;
  out[0xc] = uVar2 >> 4 & 0x7ffff;
  out[0xd] = uVar2 >> 0x17;
  uVar1 = in[8];
  out[0xd] = uVar2 >> 0x17 | (uVar1 & 0x3ff) << 9;
  out[0xe] = uVar1 >> 10 & 0x7ffff;
  out[0xf] = uVar1 >> 0x1d;
  uVar2 = in[9];
  out[0xf] = uVar1 >> 0x1d | (uVar2 & 0xffff) << 3;
  out[0x10] = uVar2 >> 0x10;
  uVar1 = in[10];
  out[0x10] = uVar2 >> 0x10 | (uVar1 & 7) << 0x10;
  out[0x11] = uVar1 >> 3 & 0x7ffff;
  out[0x12] = uVar1 >> 0x16;
  uVar2 = in[0xb];
  out[0x12] = uVar1 >> 0x16 | (uVar2 & 0x1ff) << 10;
  out[0x13] = uVar2 >> 9 & 0x7ffff;
  out[0x14] = uVar2 >> 0x1c;
  uVar1 = in[0xc];
  out[0x14] = uVar2 >> 0x1c | (uVar1 & 0x7fff) << 4;
  out[0x15] = uVar1 >> 0xf;
  uVar2 = in[0xd];
  out[0x15] = uVar1 >> 0xf | (uVar2 & 3) << 0x11;
  out[0x16] = uVar2 >> 2 & 0x7ffff;
  out[0x17] = uVar2 >> 0x15;
  uVar1 = in[0xe];
  out[0x17] = uVar2 >> 0x15 | (uVar1 & 0xff) << 0xb;
  out[0x18] = uVar1 >> 8 & 0x7ffff;
  out[0x19] = uVar1 >> 0x1b;
  uVar2 = in[0xf];
  out[0x19] = uVar1 >> 0x1b | (uVar2 & 0x3fff) << 5;
  out[0x1a] = uVar2 >> 0xe;
  uVar1 = in[0x10];
  out[0x1a] = uVar2 >> 0xe | (uVar1 & 1) << 0x12;
  out[0x1b] = uVar1 >> 1 & 0x7ffff;
  out[0x1c] = uVar1 >> 0x14;
  uVar2 = in[0x11];
  out[0x1c] = uVar1 >> 0x14 | (uVar2 & 0x7f) << 0xc;
  out[0x1d] = uVar2 >> 7 & 0x7ffff;
  out[0x1e] = uVar2 >> 0x1a;
  uVar1 = in[0x12];
  out[0x1e] = uVar2 >> 0x1a | (uVar1 & 0x1fff) << 6;
  out[0x1f] = uVar1 >> 0xd;
  return in + 0x13;
}

Assistant:

const uint32_t *__fastunpack19_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 6)) << (19 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 19);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 12)) << (19 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 19);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 18)) << (19 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 5)) << (19 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 19);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 11)) << (19 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 19);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 17)) << (19 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 4)) << (19 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 19);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 10)) << (19 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 19);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 16)) << (19 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 3)) << (19 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 19);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 9)) << (19 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 19);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 15)) << (19 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 2)) << (19 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 19);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 8)) << (19 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 19);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 14)) << (19 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 1)) << (19 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 19);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 7)) << (19 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 19);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 13)) << (19 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  out++;

  return in;
}